

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void mbedtls_ssl_update_handshake_status(mbedtls_ssl_context *ssl)

{
  uint *puVar1;
  
  if ((ssl->state != 0x10) && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
    (*ssl->handshake->update_checksum)(ssl,ssl->in_msg,ssl->in_hslen);
  }
  if (((ssl->conf->field_0x174 & 2) != 0) && (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)
     ) {
    puVar1 = &ssl->handshake->in_msg_seq;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void mbedtls_ssl_update_handshake_status( mbedtls_ssl_context *ssl )
{

    if( ssl->state != MBEDTLS_SSL_HANDSHAKE_OVER &&
        ssl->handshake != NULL )
    {
        ssl->handshake->update_checksum( ssl, ssl->in_msg, ssl->in_hslen );
    }

    /* Handshake message is complete, increment counter */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL )
    {
        ssl->handshake->in_msg_seq++;
    }
#endif
}